

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

ParserResult * __thiscall
Catch::Clara::Detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:3048:36)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:3048:36)>
          *this,string *arg)

{
  uint *puVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  Optional<unsigned_int> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  BasicResult<Catch::Clara::ParseResultType> local_48;
  
  this_00 = &bStack_b8;
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&temp);
  local_48.m_errorMessage._M_dataplus._M_p = (pointer)&local_48.m_errorMessage.field_2;
  local_48.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase.m_type = Ok;
  local_48.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._12_4_ = 0;
  local_48.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_002f3d40;
  local_48.m_errorMessage._M_string_length = 0;
  local_48.m_errorMessage.field_2._M_local_buf[0] = '\0';
  parseUInt((Catch *)&local_98,&temp,10);
  if (local_98.nullableValue == (uint *)0x0) {
    std::operator+(&local_68,"Could not parse \'",&temp);
    std::operator+(&bStack_b8,&local_68,"\' as shard count");
    BasicResult<Catch::Clara::ParseResultType>::runtimeError(__return_storage_ptr__,&bStack_b8);
    std::__cxx11::string::~string((string *)&bStack_b8);
    this_00 = &local_68;
  }
  else {
    puVar1 = Optional<unsigned_int>::operator*(&local_98);
    if (*puVar1 != 0) {
      puVar1 = Optional<unsigned_int>::operator*(&local_98);
      ((this->m_lambda).config)->shardCount = *puVar1;
      *(undefined8 *)
       &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
        super_ResultBase.m_type = 0;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_002f3d40;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
      (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
      (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
      goto LAB_001674d8;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bStack_b8,"Shard count must be positive",(allocator<char> *)&local_68);
    BasicResult<Catch::Clara::ParseResultType>::runtimeError(__return_storage_ptr__,&bStack_b8);
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_001674d8:
  BasicResult<Catch::Clara::ParseResultType>::~BasicResult(&local_48);
  std::__cxx11::string::~string((string *)&temp);
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const& arg )
                    -> ParserResult override {
                    return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>(
                        m_lambda, arg );
                }